

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

bool __thiscall gimage::PNMImageIO::handlesFile(PNMImageIO *this,char *name,bool reading)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte in_DL;
  char *in_RSI;
  string s;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 5) {
    local_1 = 0;
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aec01);
    lVar3 = std::__cxx11::string::size();
    if (lVar2 != lVar3 + -4) {
      lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aeb3c);
      lVar3 = std::__cxx11::string::size();
      if (lVar2 != lVar3 + -4) {
        lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aeabf);
        lVar3 = std::__cxx11::string::size();
        if (lVar2 != lVar3 + -4) {
          lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aeb41);
          lVar3 = std::__cxx11::string::size();
          if (lVar2 != lVar3 + -4) {
            lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aeb46);
            lVar3 = std::__cxx11::string::size();
            if (lVar2 != lVar3 + -4) {
              lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aeb4b);
              lVar3 = std::__cxx11::string::size();
              if (lVar2 != lVar3 + -4) {
                local_1 = 0;
                goto LAB_00179d5f;
              }
            }
          }
        }
      }
    }
    local_1 = 1;
  }
LAB_00179d5f:
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool PNMImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".pgm") == s.size()-4 || s.rfind(".PGM") == s.size()-4 ||
      s.rfind(".ppm") == s.size()-4 || s.rfind(".PPM") == s.size()-4 ||
      s.rfind(".pfm") == s.size()-4 || s.rfind(".PFM") == s.size()-4)
  {
    return true;
  }

  return false;
}